

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O2

bool __thiscall
obs::safe_list<obs::slot<void_(int)>_>::iterator::operator!=(iterator *this,iterator *other)

{
  pthread_mutex_t *__mutex;
  bool bVar1;
  
  __mutex = (pthread_mutex_t *)this->m_list;
  std::mutex::lock((mutex *)&__mutex->__data);
  if ((this->m_node == (node *)0x0) || (other->m_node == (node *)0x0)) {
    bVar1 = false;
  }
  else {
    bVar1 = this->m_node != other->m_node->next;
  }
  pthread_mutex_unlock(__mutex);
  return bVar1;
}

Assistant:

bool operator!=(const iterator& other) const {
      std::lock_guard<std::mutex> l(m_list.m_mutex_nodes);
      if (m_node && other.m_node)
        return (m_node != other.m_node->next);
      else
        return false;
    }